

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O2

void scan_flux_gcr(TrackData *trackdata)

{
  uint uVar1;
  FluxData *flux_revs;
  int bitcell_ns;
  BitBuffer bitbuf;
  FluxDecoder decoder;
  
  uVar1 = (trackdata->cylhead).cyl;
  bitcell_ns = 0xc80;
  if ((0x10 < (int)uVar1) && (bitcell_ns = 0xdac, 0x17 < uVar1)) {
    bitcell_ns = 4000;
    if (uVar1 < 0x1e) {
      bitcell_ns = 0xea6;
    }
  }
  flux_revs = TrackData::flux(trackdata);
  FluxDecoder::FluxDecoder(&decoder,flux_revs,bitcell_ns,opt.scale,4);
  BitBuffer::BitBuffer(&bitbuf,_250K,&decoder);
  TrackData::add(trackdata,&bitbuf);
  scan_bitstream_gcr(trackdata);
  BitBuffer::~BitBuffer(&bitbuf);
  return;
}

Assistant:

void scan_flux_gcr(TrackData& trackdata)
{
    int bitcell_ns;

    // C64 GCR disks are zoned, with variable rate depending on cylinder
    if (trackdata.cylhead.cyl < 17)
        bitcell_ns = 3200;
    else if (trackdata.cylhead.cyl < 24)
        bitcell_ns = 3500;
    else if (trackdata.cylhead.cyl < 30)
        bitcell_ns = 3750;
    else
        bitcell_ns = 4000;

    FluxDecoder decoder(trackdata.flux(), bitcell_ns, opt.scale);
    BitBuffer bitbuf(DataRate::_250K, decoder);

    trackdata.add(std::move(bitbuf));
    scan_bitstream_gcr(trackdata);
}